

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O0

HRESULT __thiscall
ChakraCoreHostScriptContext::InitializeImportMeta
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,
          Var importMetaObject)

{
  JsErrorCode JVar1;
  AutoFilterExceptionRegion local_2c;
  JsErrorCode errorCode;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  Var importMetaObject_local;
  ModuleRecordBase *referencingModule_local;
  ChakraCoreHostScriptContext *this_local;
  
  if (this->initializeImportMetaCallback == (InitializeImportMetaCallback)0x0) {
    this_local._4_4_ = -0x7ff8ffa9;
  }
  else {
    _errorCode = importMetaObject;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
    JVar1 = (*this->initializeImportMetaCallback)(referencingModule,_errorCode);
    if (JVar1 == JsNoError) {
      this_local._4_4_ = 0;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
    if (JVar1 != JsNoError) {
      this_local._4_4_ = -0x7ff8ffa9;
    }
  }
  return this_local._4_4_;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::InitializeImportMeta(Js::ModuleRecordBase* referencingModule, Js::Var importMetaObject)
{
    if (initializeImportMetaCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = initializeImportMetaCallback(referencingModule, importMetaObject);
        if (errorCode == JsNoError)
        {
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}